

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addConstraintPair(Molecule *this,ConstraintPair *cp)

{
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  _Var1;
  ConstraintPair *local_10;
  
  local_10 = cp;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::ConstraintPair**,std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::ConstraintPair*const>>
                    ((this->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->constraintPairs_).
      super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::push_back
              (&this->constraintPairs_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addConstraintPair(ConstraintPair* cp) {
    if (std::find(constraintPairs_.begin(), constraintPairs_.end(), cp) ==
        constraintPairs_.end()) {
      constraintPairs_.push_back(cp);
    }
  }